

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool __thiscall
bssl::ssl_decode_client_hello_inner
          (bssl *this,SSL *ssl,uint8_t *out_alert,Array<unsigned_char> *out_client_hello_inner,
          Span<const_unsigned_char> encoded_client_hello_inner,SSL_CLIENT_HELLO *client_hello_outer)

{
  uchar *puVar1;
  bool bVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *in;
  size_t sVar8;
  long lVar9;
  Span<const_unsigned_char> SVar10;
  Span<const_unsigned_char> SVar11;
  uint16_t want;
  uint8_t padding;
  uint16_t found;
  uint8_t *local_220;
  CBS ext_body;
  CBS outer_extensions;
  CBS ext_list_wrapper;
  Span<const_unsigned_char> inner_extensions;
  CBB body;
  CBB extensions_cbb;
  SSL_CLIENT_HELLO client_hello_inner;
  CBS cbs;
  CBB cbb_1;
  ScopedCBB cbb;
  
  sVar8 = encoded_client_hello_inner.size_;
  cbs.len = (size_t)encoded_client_hello_inner.data_;
  cbs.data = (uint8_t *)out_client_hello_inner;
  bVar2 = ssl_parse_client_hello_with_trailing_data((SSL *)this,&cbs,&client_hello_inner);
  if (!bVar2) {
    return false;
  }
  while (iVar5 = CBS_get_u8(&cbs,&padding), iVar5 != 0) {
    if (padding != '\0') {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x95);
      *(undefined1 *)&ssl->method = 0x2f;
      return false;
    }
  }
  if ((client_hello_inner.extensions_len == 0) || (client_hello_inner.session_id_len != 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x9f);
    return false;
  }
  client_hello_inner.session_id = *(uint8_t **)(sVar8 + 0x30);
  client_hello_inner.session_id_len = *(size_t *)(sVar8 + 0x38);
  CBB_zero(&cbb.ctx_);
  cVar3 = (**(code **)(*(long *)this + 0x58))(this,&cbb.ctx_,&body,1);
  if ((((((((cVar3 == '\0') || (iVar5 = CBB_add_u16(&body,client_hello_inner.version), iVar5 == 0))
          || (iVar5 = CBB_add_bytes(&body,client_hello_inner.random,client_hello_inner.random_len),
             iVar5 == 0)) ||
         ((iVar5 = CBB_add_u8_length_prefixed(&body,&cbb_1), iVar5 == 0 ||
          (iVar5 = CBB_add_bytes(&cbb_1,client_hello_inner.session_id,
                                 client_hello_inner.session_id_len), iVar5 == 0)))) ||
        ((iVar5 = SSL_is_dtls(client_hello_inner.ssl), iVar5 != 0 &&
         ((iVar5 = CBB_add_u8_length_prefixed(&body,&cbb_1), iVar5 == 0 ||
          (iVar5 = CBB_add_bytes(&cbb_1,client_hello_inner.dtls_cookie,
                                 client_hello_inner.dtls_cookie_len), iVar5 == 0)))))) ||
       (iVar5 = CBB_add_u16_length_prefixed(&body,&cbb_1), iVar5 == 0)) ||
      (((iVar5 = CBB_add_bytes(&cbb_1,client_hello_inner.cipher_suites,
                               client_hello_inner.cipher_suites_len), iVar5 == 0 ||
        (iVar5 = CBB_add_u8_length_prefixed(&body,&cbb_1), iVar5 == 0)) ||
       (iVar5 = CBB_add_bytes(&cbb_1,client_hello_inner.compression_methods,
                              client_hello_inner.compression_methods_len), iVar5 == 0)))) ||
     ((iVar5 = CBB_flush(&body), iVar5 == 0 ||
      (iVar5 = CBB_add_u16_length_prefixed(&body,&extensions_cbb), iVar5 == 0)))) {
    bVar2 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0xab);
    goto LAB_001309ee;
  }
  inner_extensions.data_ = client_hello_inner.extensions;
  inner_extensions.size_ = client_hello_inner.extensions_len;
  bVar2 = ssl_client_hello_get_extension(&client_hello_inner,&ext_list_wrapper,0xfd00);
  puVar1 = inner_extensions.data_;
  if (bVar2) {
    SVar10 = Span<const_unsigned_char>::subspan
                       (&inner_extensions,0,
                        (size_t)(ext_list_wrapper.data + (-4 - (long)inner_extensions.data_)));
    local_220 = SVar10.data_;
    SVar11 = Span<const_unsigned_char>::subspan
                       (&inner_extensions,
                        (size_t)(ext_list_wrapper.data + (ext_list_wrapper.len - (long)puVar1)),
                        0xffffffffffffffff);
    iVar5 = CBB_add_bytes(&extensions_cbb,local_220,SVar10.size_);
    if (iVar5 == 0) {
      bVar2 = false;
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0xc2);
      goto LAB_001309ee;
    }
    local_220 = SVar11.data_;
    iVar5 = CBS_get_u8_length_prefixed(&ext_list_wrapper,(CBS *)&cbb_1);
    if (((iVar5 == 0) || (cbb_1._8_8_ == 0)) || (ext_list_wrapper.len != 0)) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0xca);
    }
    else {
      outer_extensions.data = *(uint8_t **)(sVar8 + 0x70);
      outer_extensions.len = *(size_t *)(sVar8 + 0x78);
      iVar5 = 0x89;
      lVar9 = 1;
      do {
        if (lVar9 == 0) {
          iVar5 = CBB_add_bytes(&extensions_cbb,local_220,SVar11.size_);
          if (iVar5 != 0) goto LAB_00130a2e;
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0xf9);
          goto LAB_00130c14;
        }
        iVar6 = CBS_get_u16((CBS *)&cbb_1,&want);
        if (iVar6 == 0) {
          iVar6 = 0xd4;
          iVar5 = 0x89;
LAB_00130c90:
          ERR_put_error(0x10,0,iVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,iVar6);
          goto LAB_00130c14;
        }
        if (want == 0xfe0d) {
          *(undefined1 *)&ssl->method = 0x2f;
          iVar6 = 0xda;
          iVar5 = 0x140;
          goto LAB_00130c90;
        }
        do {
          if (outer_extensions.len == 0) {
            *(undefined1 *)&ssl->method = 0x2f;
            iVar6 = 0xe4;
            iVar5 = 0x140;
            goto LAB_00130bfe;
          }
          iVar7 = CBS_get_u16(&outer_extensions,&found);
          iVar6 = 0xe9;
          if ((iVar7 == 0) ||
             (iVar7 = CBS_get_u16_length_prefixed(&outer_extensions,&ext_body), iVar7 == 0))
          goto LAB_00130bfe;
        } while (found != want);
        iVar7 = CBB_add_u16(&extensions_cbb,found);
        iVar6 = 0xf2;
      } while (((iVar7 != 0) &&
               (iVar7 = CBB_add_u16(&extensions_cbb,(uint16_t)ext_body.len), iVar7 != 0)) &&
              (iVar7 = CBB_add_bytes(&extensions_cbb,ext_body.data,
                                     CONCAT62(ext_body.len._2_6_,(uint16_t)ext_body.len)),
              lVar9 = cbb_1._8_8_, iVar7 != 0));
LAB_00130bfe:
      ERR_put_error(0x10,0,iVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,iVar6);
    }
    goto LAB_00130c14;
  }
  iVar5 = CBB_add_bytes(&extensions_cbb,inner_extensions.data_,inner_extensions.size_);
  if (iVar5 == 0) {
    iVar5 = 0xb7;
  }
  else {
LAB_00130a2e:
    iVar5 = CBB_flush(&body);
    if (iVar5 != 0) {
      in = CBB_data(&body);
      sVar8 = CBB_len(&body);
      iVar5 = SSL_parse_client_hello((SSL *)this,(SSL_CLIENT_HELLO *)&cbb_1,in,sVar8);
      if ((((iVar5 == 0) ||
           (bVar2 = ssl_client_hello_get_extension
                              ((SSL_CLIENT_HELLO *)&cbb_1,&outer_extensions,0xfe0d), !bVar2)) ||
          (outer_extensions.len != 1)) ||
         ((*outer_extensions.data != '\x01' ||
          (bVar2 = ssl_client_hello_get_extension((SSL_CLIENT_HELLO *)&cbb_1,&outer_extensions,0x2b)
          , !bVar2)))) {
        *(undefined1 *)&ssl->method = 0x2f;
        ERR_put_error(0x10,0,0x13a,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0x68);
      }
      else {
        iVar5 = CBS_get_u8_length_prefixed(&outer_extensions,&ext_body);
        if (((iVar5 != 0) && (outer_extensions.len == 0)) &&
           (CONCAT62(ext_body.len._2_6_,(uint16_t)ext_body.len) != 0)) {
          lVar9 = 1;
          while (lVar9 != 0) {
            iVar5 = CBS_get_u16(&ext_body,&want);
            if (iVar5 == 0) {
              iVar5 = 0x89;
              uVar4 = 0x32;
              iVar6 = 0x79;
LAB_00130cda:
              *(undefined1 *)&ssl->method = uVar4;
              ERR_put_error(0x10,0,iVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,iVar6);
              goto LAB_00130c14;
            }
            iVar6 = 0x80;
            iVar5 = 0x13a;
            uVar4 = 0x2f;
            if (((want - 0x300 < 4) || (want == 0xfefd)) || (want == 0xfeff)) goto LAB_00130cda;
            lVar9 = CONCAT62(ext_body.len._2_6_,(uint16_t)ext_body.len);
          }
          cVar3 = (**(code **)(*(long *)this + 0x60))(this,&cbb,out_alert);
          iVar5 = 0x108;
          bVar2 = true;
          if (cVar3 != '\0') goto LAB_001309ee;
          goto LAB_00130bd5;
        }
        *(undefined1 *)&ssl->method = 0x32;
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0x72);
      }
LAB_00130c14:
      bVar2 = false;
      goto LAB_001309ee;
    }
    iVar5 = 0xfe;
  }
LAB_00130bd5:
  bVar2 = false;
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,iVar5);
LAB_001309ee:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  return bVar2;
}

Assistant:

bool ssl_decode_client_hello_inner(
    SSL *ssl, uint8_t *out_alert, Array<uint8_t> *out_client_hello_inner,
    Span<const uint8_t> encoded_client_hello_inner,
    const SSL_CLIENT_HELLO *client_hello_outer) {
  SSL_CLIENT_HELLO client_hello_inner;
  CBS cbs = encoded_client_hello_inner;
  if (!ssl_parse_client_hello_with_trailing_data(ssl, &cbs,
                                                 &client_hello_inner)) {
    return false;
  }
  // The remaining data is padding.
  uint8_t padding;
  while (CBS_get_u8(&cbs, &padding)) {
    if (padding != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }
  }

  // TLS 1.3 ClientHellos must have extensions, and EncodedClientHelloInners use
  // ClientHelloOuter's session_id.
  if (client_hello_inner.extensions_len == 0 ||
      client_hello_inner.session_id_len != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  client_hello_inner.session_id = client_hello_outer->session_id;
  client_hello_inner.session_id_len = client_hello_outer->session_id_len;

  // Begin serializing a message containing the ClientHelloInner in |cbb|.
  ScopedCBB cbb;
  CBB body, extensions_cbb;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !ssl_client_hello_write_without_extensions(&client_hello_inner, &body) ||
      !CBB_add_u16_length_prefixed(&body, &extensions_cbb)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  auto inner_extensions =
      Span(client_hello_inner.extensions, client_hello_inner.extensions_len);
  CBS ext_list_wrapper;
  if (!ssl_client_hello_get_extension(&client_hello_inner, &ext_list_wrapper,
                                      TLSEXT_TYPE_ech_outer_extensions)) {
    // No ech_outer_extensions. Copy everything.
    if (!CBB_add_bytes(&extensions_cbb, inner_extensions.data(),
                       inner_extensions.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  } else {
    const size_t offset = CBS_data(&ext_list_wrapper) - inner_extensions.data();
    auto inner_extensions_before =
        inner_extensions.subspan(0, offset - 4 /* extension header */);
    auto inner_extensions_after =
        inner_extensions.subspan(offset + CBS_len(&ext_list_wrapper));
    if (!CBB_add_bytes(&extensions_cbb, inner_extensions_before.data(),
                       inner_extensions_before.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }

    // Expand ech_outer_extensions. See draft-ietf-tls-esni-13, Appendix B.
    CBS ext_list;
    if (!CBS_get_u8_length_prefixed(&ext_list_wrapper, &ext_list) ||
        CBS_len(&ext_list) == 0 || CBS_len(&ext_list_wrapper) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    CBS outer_extensions;
    CBS_init(&outer_extensions, client_hello_outer->extensions,
             client_hello_outer->extensions_len);
    while (CBS_len(&ext_list) != 0) {
      // Find the next extension to copy.
      uint16_t want;
      if (!CBS_get_u16(&ext_list, &want)) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        return false;
      }
      // The ECH extension itself is not in the AAD and may not be referenced.
      if (want == TLSEXT_TYPE_encrypted_client_hello) {
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_EXTENSION);
        return false;
      }
      // Seek to |want| in |outer_extensions|. |ext_list| is required to match
      // ClientHelloOuter in order.
      uint16_t found;
      CBS ext_body;
      do {
        if (CBS_len(&outer_extensions) == 0) {
          *out_alert = SSL_AD_ILLEGAL_PARAMETER;
          OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_EXTENSION);
          return false;
        }
        if (!CBS_get_u16(&outer_extensions, &found) ||
            !CBS_get_u16_length_prefixed(&outer_extensions, &ext_body)) {
          OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
          return false;
        }
      } while (found != want);
      // Copy the extension.
      if (!CBB_add_u16(&extensions_cbb, found) ||
          !CBB_add_u16(&extensions_cbb, CBS_len(&ext_body)) ||
          !CBB_add_bytes(&extensions_cbb, CBS_data(&ext_body),
                         CBS_len(&ext_body))) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        return false;
      }
    }

    if (!CBB_add_bytes(&extensions_cbb, inner_extensions_after.data(),
                       inner_extensions_after.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }
  if (!CBB_flush(&body)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!is_valid_client_hello_inner(ssl, out_alert,
                                   Span(CBB_data(&body), CBB_len(&body)))) {
    return false;
  }

  if (!ssl->method->finish_message(ssl, cbb.get(), out_client_hello_inner)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  return true;
}